

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

nk_style_item *
nk_draw_button(nk_command_buffer *out,nk_rect *bounds,nk_flags state,nk_style_button *style)

{
  nk_style_item *pnVar1;
  ulong uVar2;
  
  uVar2 = 0x20;
  if ((state & 0x10) == 0) {
    uVar2 = (ulong)(state * 2 & 0x40);
  }
  pnVar1 = (nk_style_item *)((long)&(style->normal).type + uVar2);
  if (*(int *)((long)&(style->normal).type + uVar2) == 1) {
    nk_draw_image(out,*bounds,&(pnVar1->data).image,(nk_color)0xffffffff);
  }
  else {
    nk_fill_rect(out,*bounds,style->rounding,(pnVar1->data).color);
    nk_stroke_rect(out,*bounds,style->rounding,style->border,style->border_color);
  }
  return pnVar1;
}

Assistant:

NK_LIB const struct nk_style_item*
nk_draw_button(struct nk_command_buffer *out,
    const struct nk_rect *bounds, nk_flags state,
    const struct nk_style_button *style)
{
    const struct nk_style_item *background;
    if (state & NK_WIDGET_STATE_HOVER)
        background = &style->hover;
    else if (state & NK_WIDGET_STATE_ACTIVED)
        background = &style->active;
    else background = &style->normal;

    if (background->type == NK_STYLE_ITEM_IMAGE) {
        nk_draw_image(out, *bounds, &background->data.image, nk_white);
    } else {
        nk_fill_rect(out, *bounds, style->rounding, background->data.color);
        nk_stroke_rect(out, *bounds, style->rounding, style->border, style->border_color);
    }
    return background;
}